

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedProcedure.cpp
# Opt level: O3

void slang::analysis::stringifyLSP(Expression *expr,EvalContext *evalContext,FormatBuffer *buffer)

{
  ExpressionKind EVar1;
  long lVar2;
  char *begin;
  MemberAccessExpression *access;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  undefined1 local_d8 [40];
  string local_b0;
  string local_90;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_70;
  pointer local_48;
  size_type sStack_40;
  pointer local_38;
  size_type sStack_30;
  
  for (; EVar1 = (((Type *)expr)->super_Symbol).kind, EVar1 == Conversion;
      expr = (Expression *)(((Expression *)((long)&((Type *)expr)->super_Symbol + 0x30))->type).ptr)
  {
  }
  if ((int)EVar1 < 0x12) {
LAB_0037e03f:
    lVar2 = *(long *)((long)&((Type *)expr)->super_Symbol + 0x30);
    begin = *(char **)(lVar2 + 0x10);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)buffer,begin,begin + *(long *)(lVar2 + 8));
    return;
  }
  if (EVar1 == ElementSelect) {
    stringifyLSP(*(Expression **)((long)&((Type *)expr)->super_Symbol + 0x30),evalContext,buffer);
    ast::Expression::eval
              ((ConstantValue *)&local_70,
               *(Expression **)((long)&((Type *)expr)->super_Symbol + 0x38),evalContext);
    ConstantValue::toString_abi_cxx11_
              ((string *)local_d8,(ConstantValue *)&local_70,0x80,false,false);
    local_48 = (pointer)local_d8._0_8_;
    sStack_40 = local_d8._8_8_;
    fmt_00.size_ = 4;
    fmt_00.data_ = "[{}]";
    args_00.field_1.values_ = (value<fmt::v11::context> *)&local_48;
    args_00.desc_ = 0xd;
    ::fmt::v11::detail::vformat_to((buffer<char> *)buffer,fmt_00,args_00,(locale_ref)0x0);
    if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) goto LAB_0037e001;
  }
  else {
    if (EVar1 != RangeSelect) {
      stringifyLSP(*(Expression **)((long)&((Type *)expr)->super_Symbol + 0x38),evalContext,buffer);
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)buffer,".","");
      goto LAB_0037e03f;
    }
    stringifyLSP(*(Expression **)((long)&((Type *)expr)->super_Symbol + 0x30),evalContext,buffer);
    ast::Expression::eval
              ((ConstantValue *)&local_70,
               *(Expression **)((long)&((Type *)expr)->super_Symbol + 0x38),evalContext);
    ConstantValue::toString_abi_cxx11_(&local_90,(ConstantValue *)&local_70,0x80,false,false);
    ast::Expression::eval
              ((ConstantValue *)local_d8,(Expression *)((Type *)expr)->canonical,evalContext);
    ConstantValue::toString_abi_cxx11_(&local_b0,(ConstantValue *)local_d8,0x80,false,false);
    local_48 = local_90._M_dataplus._M_p;
    sStack_40 = local_90._M_string_length;
    local_38 = local_b0._M_dataplus._M_p;
    sStack_30 = local_b0._M_string_length;
    fmt.size_ = 7;
    fmt.data_ = "[{}:{}]";
    args.field_1.values_ = (value<fmt::v11::context> *)&local_48;
    args.desc_ = 0xdd;
    ::fmt::v11::detail::vformat_to((buffer<char> *)buffer,fmt,args,(locale_ref)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)local_d8);
    local_d8._16_8_ = local_90.field_2._M_allocated_capacity;
    local_d8._0_8_ = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0037e001;
  }
  operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
LAB_0037e001:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_70);
  return;
}

Assistant:

static void stringifyLSP(const Expression& expr, EvalContext& evalContext, FormatBuffer& buffer) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            buffer.append(expr.as<ValueExpressionBase>().symbol.name);
            break;
        case ExpressionKind::Conversion:
            stringifyLSP(expr.as<ConversionExpression>().operand(), evalContext, buffer);
            break;
        case ExpressionKind::ElementSelect: {
            auto& select = expr.as<ElementSelectExpression>();
            stringifyLSP(select.value(), evalContext, buffer);
            buffer.format("[{}]", select.selector().eval(evalContext).toString());
            break;
        }
        case ExpressionKind::RangeSelect: {
            auto& select = expr.as<RangeSelectExpression>();
            stringifyLSP(select.value(), evalContext, buffer);
            buffer.format("[{}:{}]", select.left().eval(evalContext).toString(),
                          select.right().eval(evalContext).toString());
            break;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = expr.as<MemberAccessExpression>();
            stringifyLSP(access.value(), evalContext, buffer);
            buffer.append(".");
            buffer.append(access.member.name);
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }
}